

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::reset(QAbstractItemView *this)

{
  byte bVar1;
  int iVar2;
  SizeAdjustPolicy SVar3;
  QAbstractItemViewPrivate *this_00;
  Entry *pEVar4;
  long lVar5;
  QWidget *this_01;
  QObject *pQVar6;
  Data *pDVar7;
  piter pVar8;
  char cVar9;
  long *plVar10;
  QWidget *editor;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *pDVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  piter pVar13;
  QKeyValueRange<const_QHash<QPersistentModelIndex,_QEditorInfo>_&> local_98;
  QHash<QPersistentModelIndex,_QEditorInfo> local_90;
  void *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  QAbstractItemView *pQStack_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  QBasicTimer::stop();
  local_90.d = (this_00->indexEditorHash).d;
  if ((local_90.d != (Data *)0x0) &&
     (((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.super_QKeyValueRangeStorage<const_QHash<QPersistentModelIndex,_QEditorInfo>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<QPersistentModelIndex,_QEditorInfo>_&>)&local_90;
  pVar13 = (piter)QtPrivate::QKeyValueRange<const_QHash<QPersistentModelIndex,_QEditorInfo>_&>::
                  begin(&local_98);
  if (pVar13.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0 ||
      pVar13.bucket != 0) {
    do {
      uVar12 = pVar13.bucket;
      pDVar11 = pVar13.d;
      pEVar4 = pDVar11->spans[uVar12 >> 7].entries;
      bVar1 = pDVar11->spans[uVar12 >> 7].offsets[(uint)pVar13.bucket & 0x7f];
      lVar5 = *(long *)(pEVar4[bVar1].storage.data + 8);
      if (((lVar5 != 0) && (*(int *)(lVar5 + 4) != 0)) &&
         (this_01 = *(QWidget **)(pEVar4[bVar1].storage.data + 0x10), this_01 != (QWidget *)0x0)) {
        iVar2 = *(int *)(lVar5 + 4);
        editor = this_01;
        if (*(int *)(lVar5 + 4) == 0) {
          editor = (QWidget *)0x0;
        }
        QAbstractItemViewPrivate::indexForEditor((QModelIndex *)local_68,this_00,editor);
        if (iVar2 != 0) {
          pQVar6 = *(QObject **)
                    &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x8;
          local_78 = QObject::destroyed;
          local_70 = 0;
          local_88 = (void *)0x2a1;
          local_80 = 0;
          QObject::disconnectImpl
                    (&this_01->super_QObject,&local_78,pQVar6,&local_88,
                     (QMetaObject *)&QObject::staticMetaObject);
          QObject::removeEventFilter(&this_01->super_QObject);
          QWidget::hide(this_01);
          plVar10 = (long *)(**(code **)(*(long *)pQVar6 + 0x208))(pQVar6,local_68);
          if (plVar10 == (long *)0x0) {
            QObject::deleteLater();
          }
          else {
            (**(code **)(*plVar10 + 0x78))(plVar10,this_01,local_68);
          }
        }
      }
      do {
        if (pDVar11->numBuckets - 1 == uVar12) {
          uVar12 = 0;
          pDVar11 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0;
          break;
        }
        uVar12 = uVar12 + 1;
      } while (pDVar11->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f] == 0xff);
      pVar8.bucket = uVar12;
      pVar8.d = pDVar11;
      pVar13.bucket = uVar12;
      pVar13.d = pDVar11;
    } while ((pDVar11 != (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0) ||
            (pVar13 = pVar8, uVar12 != 0));
  }
  QHash<QWidget_*,_QPersistentModelIndex>::clear(&this_00->editorIndexHash);
  QHash<QPersistentModelIndex,_QEditorInfo>::clear(&this_00->indexEditorHash);
  QHash<QWidget_*,_QHashDummyValue>::clear(&(this_00->persistent).q_hash);
  this_00->currentIndexSet = false;
  *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
  local_68._0_8_ = (code *)0xffffffffffffffff;
  stack0xffffffffffffffa0 = (undefined1  [16])0x0;
  (**(code **)(*(long *)this + 0x218))(this);
  pDVar7 = (this_00->selectionModel).wp.d;
  if ((pDVar7 != (Data *)0x0) &&
     ((*(int *)(pDVar7 + 4) != 0 &&
      (pQVar6 = (this_00->selectionModel).wp.value, pQVar6 != (QObject *)0x0)))) {
    (**(code **)(*(long *)pQVar6 + 0x80))();
  }
  cVar9 = QAccessible::isActive();
  if (cVar9 != '\0') {
    pQStack_58 = this;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = 0xffffffff;
    local_68._0_8_ = QIcon::QIcon;
    local_48 = 0xffffffff;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    local_68._8_4_ = 0x116;
    QAccessible::updateAccessibility((QAccessibleEvent *)local_68);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)local_68);
  }
  SVar3 = (this_00->super_QAbstractScrollAreaPrivate).sizeAdjustPolicy;
  if ((SVar3 != AdjustIgnored) &&
     ((SVar3 == AdjustToContents || ((this_00->super_QAbstractScrollAreaPrivate).shownOnce == false)
      ))) {
    QWidget::updateGeometry
              (*(QWidget **)
                &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                 super_QWidgetPrivate.field_0x8);
  }
  QHash<QPersistentModelIndex,_QEditorInfo>::~QHash(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::reset()
{
    Q_D(QAbstractItemView);
    d->delayedReset.stop(); //make sure we stop the timer
    // Taking a copy because releaseEditor() eventurally calls deleteLater() on the
    // editor, which calls QCoreApplication::postEvent(), the latter may invoke unknown
    // code that may modify d->indexEditorHash.
    const auto copy = d->indexEditorHash;
    for (const auto &[index, info] : copy.asKeyValueRange()) {
        if (info.widget)
            d->releaseEditor(info.widget.data(), d->indexForEditor(info.widget.data()));
    }
    d->editorIndexHash.clear();
    d->indexEditorHash.clear();
    d->persistent.clear();
    d->currentIndexSet = false;
    setState(NoState);
    setRootIndex(QModelIndex());
    if (d->selectionModel)
        d->selectionModel->reset();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->updateGeometry();
}